

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O0

void ZydisSetOperandSizeAndElementInfo
               (ZydisDecoderContext *context,ZydisDecodedInstruction *instruction,
               ZydisDecodedOperand *operand,ZydisOperandDefinition *definition)

{
  ZyanU8 ZVar1;
  ZydisInstructionEncoding ZVar2;
  ZydisBroadcastMode ZVar3;
  ZydisRegisterWidth ZVar4;
  ZydisOperandDefinition *definition_local;
  ZydisDecodedOperand *operand_local;
  ZydisDecodedInstruction *instruction_local;
  ZydisDecoderContext *context_local;
  
  if (context == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x3c7,
                  "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                 );
  }
  if (instruction == (ZydisDecodedInstruction *)0x0) {
    __assert_fail("instruction",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x3c8,
                  "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                 );
  }
  if (operand == (ZydisDecodedOperand *)0x0) {
    __assert_fail("operand",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x3c9,
                  "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                 );
  }
  if (definition == (ZydisOperandDefinition *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x3ca,
                  "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                 );
  }
  switch(operand->type) {
  case ZYDIS_OPERAND_TYPE_REGISTER:
    if (definition->size[context->eosz_index] == 0) {
      ZVar4 = ZydisRegisterGetWidth(instruction->machine_mode,(operand->field_10).mem.type);
      operand->size = ZVar4;
    }
    else {
      operand->size = definition->size[context->eosz_index] << 3;
    }
    operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
    operand->element_size = operand->size;
    break;
  case ZYDIS_OPERAND_TYPE_MEMORY:
    ZVar2 = instruction->encoding;
    if (ZVar2 < ZYDIS_INSTRUCTION_ENCODING_EVEX) {
      if ((operand->field_10).mem.type == ZYDIS_MEMOP_TYPE_AGEN) {
        if (definition->size[context->eosz_index] != 0) {
          __assert_fail("definition->size[context->eosz_index] == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x3e6,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        operand->size = (ushort)instruction->address_width;
        operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
      }
      else {
        if ((definition->size[context->eosz_index] == 0) &&
           ((instruction->meta).category != ZYDIS_CATEGORY_AMX_TILE)) {
          __assert_fail("definition->size[context->eosz_index] || (instruction->meta.category == ZYDIS_CATEGORY_AMX_TILE)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x3ec,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        operand->size = definition->size[context->eosz_index] << 3;
      }
    }
    else if (ZVar2 == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
      if (definition->size[context->eosz_index] == 0) {
        if ((instruction->avx).vector_length == 0) {
          __assert_fail("instruction->avx.vector_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x3fa,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        if ((context->evex).element_size == '\0') {
          __assert_fail("context->evex.element_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x3fb,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        ZVar1 = (context->evex).tuple_type;
        if (ZVar1 == '\x01') {
          if ((instruction->avx).broadcast.mode == ZYDIS_BROADCAST_MODE_INVALID) {
            operand->size = (instruction->avx).vector_length;
          }
          else {
            operand->size = (ushort)(context->evex).element_size;
          }
        }
        else if (ZVar1 == '\x02') {
          if ((instruction->avx).broadcast.mode == ZYDIS_BROADCAST_MODE_INVALID) {
            operand->size = (instruction->avx).vector_length / 2;
          }
          else {
            operand->size = (ushort)(context->evex).element_size;
          }
        }
        else {
          if (ZVar1 != '\x10') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x41b,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          if ((instruction->avx).broadcast.mode == ZYDIS_BROADCAST_MODE_INVALID) {
            operand->size = (instruction->avx).vector_length / 4;
          }
          else {
            operand->size = (ushort)(context->evex).element_size;
          }
        }
      }
      else {
        operand->size = definition->size[context->eosz_index] << 3;
      }
      if (operand->size == 0) {
        __assert_fail("operand->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x41e,
                      "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                     );
      }
    }
    else {
      if (ZVar2 != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x48f,
                      "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                     );
      }
      if (definition->size[context->eosz_index] == 0) {
        if ((definition->field_0x8 & 0x1f) != 1) {
          __assert_fail("definition->element_type == ZYDIS_IELEMENT_TYPE_VARIABLE",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x42b,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        if ((instruction->avx).vector_length != 0x200) {
          __assert_fail("instruction->avx.vector_length == 512",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x42c,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        switch((instruction->avx).conversion.mode) {
        case ZYDIS_CONVERSION_MODE_INVALID:
          operand->size = 0x200;
          switch((context->mvex).functionality) {
          case '\n':
          case '\f':
          case '\x12':
          case '\x16':
            operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT32;
            operand->element_size = 0x20;
            break;
          case '\v':
            operand->size = 0x100;
            operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT32;
            operand->element_size = 0x20;
            break;
          case '\r':
          case '\x13':
          case '\x17':
            operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT64;
            operand->element_size = 0x40;
            break;
          case '\x0e':
          case '\x10':
          case '\x14':
          case '\x18':
            operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
            operand->element_size = 0x20;
            break;
          case '\x0f':
            operand->size = 0x100;
            operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
            operand->element_size = 0x20;
            break;
          case '\x11':
          case '\x15':
          case '\x19':
            operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
            operand->element_size = 0x40;
            break;
          default:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x459,
                          "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                         );
          }
          break;
        case ZYDIS_CONVERSION_MODE_FLOAT16:
          operand->size = 0x100;
          operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT16;
          operand->element_size = 0x10;
          break;
        case ZYDIS_CONVERSION_MODE_SINT8:
          operand->size = 0x80;
          operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
          operand->element_size = 8;
          break;
        case ZYDIS_CONVERSION_MODE_REQUIRED_BITS:
          operand->size = 0x80;
          operand->element_type = ZYDIS_ELEMENT_TYPE_UINT;
          operand->element_size = 8;
          break;
        case ZYDIS_CONVERSION_MODE_SINT16:
          operand->size = 0x100;
          operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
          operand->element_size = 0x10;
          break;
        case ZYDIS_CONVERSION_MODE_MAX_VALUE:
          operand->size = 0x100;
          operand->element_type = ZYDIS_ELEMENT_TYPE_UINT;
          operand->element_size = 0x10;
          break;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x476,
                        "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                       );
        }
        ZVar3 = (instruction->avx).broadcast.mode;
        if (ZVar3 != ZYDIS_BROADCAST_MODE_INVALID) {
          if (ZVar3 - ZYDIS_BROADCAST_MODE_1_TO_8 < 2) {
            operand->size = operand->element_size;
          }
          else {
            if (1 < ZVar3 - ZYDIS_BROADCAST_MODE_4_TO_8) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0x487,
                            "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                           );
            }
            operand->size = operand->element_size << 2;
          }
        }
      }
      else {
        operand->size = definition->size[context->eosz_index] << 3;
      }
    }
    break;
  case ZYDIS_OPERAND_TYPE_POINTER:
    if (((instruction->raw).imm[0].size != '\x10') && ((instruction->raw).imm[0].size != ' ')) {
      __assert_fail("(instruction->raw.imm[0].size == 16) || (instruction->raw.imm[0].size == 32)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x494,
                    "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                   );
    }
    if ((instruction->raw).imm[1].size != '\x10') {
      __assert_fail("instruction->raw.imm[1].size == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x495,
                    "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                   );
    }
    operand->size = (ushort)(instruction->raw).imm[0].size + (ushort)(instruction->raw).imm[1].size;
    break;
  case ZYDIS_OPERAND_TYPE_IMMEDIATE:
    operand->size = definition->size[context->eosz_index] << 3;
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x49c,
                  "void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZydisDecodedOperand *, const ZydisOperandDefinition *)"
                 );
  }
  if ((((definition->field_0x8 & 0x1f) != 0) && ((definition->field_0x8 & 0x1f) != 1)) &&
     (ZydisGetElementInfo((uint)(definition->field_0x8 & 0x1f),&operand->element_type,
                          &operand->element_size), operand->element_size == 0)) {
    operand->element_size = operand->size;
  }
  if (((operand->element_size == 0) || (operand->size == 0)) ||
     (operand->element_type == ZYDIS_ELEMENT_TYPE_CC)) {
    operand->element_count = 1;
  }
  else {
    operand->element_count =
         (ZyanU16)((ulong)operand->size / (ulong)(long)(int)(uint)operand->element_size);
  }
  return;
}

Assistant:

static void ZydisSetOperandSizeAndElementInfo(const ZydisDecoderContext* context,
    const ZydisDecodedInstruction* instruction, ZydisDecodedOperand* operand,
    const ZydisOperandDefinition* definition)
{
    ZYAN_ASSERT(context);
    ZYAN_ASSERT(instruction);
    ZYAN_ASSERT(operand);
    ZYAN_ASSERT(definition);

    // Operand size
    switch (operand->type)
    {
    case ZYDIS_OPERAND_TYPE_REGISTER:
    {
        if (definition->size[context->eosz_index])
        {
            operand->size = definition->size[context->eosz_index] * 8;
        } else
        {
            operand->size = ZydisRegisterGetWidth(instruction->machine_mode,
                operand->reg.value);
        }
        operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
        operand->element_size = operand->size;
        break;
    }
    case ZYDIS_OPERAND_TYPE_MEMORY:
        switch (instruction->encoding)
        {
        case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
        case ZYDIS_INSTRUCTION_ENCODING_XOP:
        case ZYDIS_INSTRUCTION_ENCODING_VEX:
            if (operand->mem.type == ZYDIS_MEMOP_TYPE_AGEN)
            {
                ZYAN_ASSERT(definition->size[context->eosz_index] == 0);
                operand->size = instruction->address_width;
                operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
            } else
            {
                ZYAN_ASSERT(definition->size[context->eosz_index] ||
                    (instruction->meta.category == ZYDIS_CATEGORY_AMX_TILE));
                operand->size = definition->size[context->eosz_index] * 8;
            }
            break;
        case ZYDIS_INSTRUCTION_ENCODING_EVEX:
#ifndef ZYDIS_DISABLE_AVX512
            if (definition->size[context->eosz_index])
            {
                // Operand size is hardcoded
                operand->size = definition->size[context->eosz_index] * 8;
            } else
            {
                // Operand size depends on the tuple-type, the element-size and the number of
                // elements
                ZYAN_ASSERT(instruction->avx.vector_length);
                ZYAN_ASSERT(context->evex.element_size);
                switch (context->evex.tuple_type)
                {
                case ZYDIS_TUPLETYPE_FV:
                    if (instruction->avx.broadcast.mode)
                    {
                        operand->size = context->evex.element_size;
                    } else
                    {
                        operand->size = instruction->avx.vector_length;
                    }
                    break;
                case ZYDIS_TUPLETYPE_HV:
                    if (instruction->avx.broadcast.mode)
                    {
                        operand->size = context->evex.element_size;
                    } else
                    {
                        operand->size = (ZyanU16)instruction->avx.vector_length / 2;
                    }
                    break;
                case ZYDIS_TUPLETYPE_QUARTER:
                    if (instruction->avx.broadcast.mode)
                    {
                        operand->size = context->evex.element_size;
                    }
                    else
                    {
                        operand->size = (ZyanU16)instruction->avx.vector_length / 4;
                    }
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }
            }
            ZYAN_ASSERT(operand->size);
#else
            ZYAN_UNREACHABLE;
#endif
            break;
        case ZYDIS_INSTRUCTION_ENCODING_MVEX:
#ifndef ZYDIS_DISABLE_KNC
            if (definition->size[context->eosz_index])
            {
                // Operand size is hardcoded
                operand->size = definition->size[context->eosz_index] * 8;
            } else
            {
                ZYAN_ASSERT(definition->element_type == ZYDIS_IELEMENT_TYPE_VARIABLE);
                ZYAN_ASSERT(instruction->avx.vector_length == 512);

                switch (instruction->avx.conversion.mode)
                {
                case ZYDIS_CONVERSION_MODE_INVALID:
                    operand->size = 512;
                    switch (context->mvex.functionality)
                    {
                    case ZYDIS_MVEX_FUNC_SF_32:
                    case ZYDIS_MVEX_FUNC_SF_32_BCST_4TO16:
                    case ZYDIS_MVEX_FUNC_UF_32:
                    case ZYDIS_MVEX_FUNC_DF_32:
                        operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT32;
                        operand->element_size = 32;
                        break;
                    case ZYDIS_MVEX_FUNC_SF_32_BCST:
                        operand->size = 256;
                        operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT32;
                        operand->element_size = 32;
                        break;
                    case ZYDIS_MVEX_FUNC_SI_32:
                    case ZYDIS_MVEX_FUNC_SI_32_BCST_4TO16:
                    case ZYDIS_MVEX_FUNC_UI_32:
                    case ZYDIS_MVEX_FUNC_DI_32:
                        operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
                        operand->element_size = 32;
                        break;
                    case ZYDIS_MVEX_FUNC_SI_32_BCST:
                        operand->size = 256;
                        operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
                        operand->element_size = 32;
                        break;
                    case ZYDIS_MVEX_FUNC_SF_64:
                    case ZYDIS_MVEX_FUNC_UF_64:
                    case ZYDIS_MVEX_FUNC_DF_64:
                        operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT64;
                        operand->element_size = 64;
                        break;
                    case ZYDIS_MVEX_FUNC_SI_64:
                    case ZYDIS_MVEX_FUNC_UI_64:
                    case ZYDIS_MVEX_FUNC_DI_64:
                        operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
                        operand->element_size = 64;
                        break;
                    default:
                        ZYAN_UNREACHABLE;
                    }
                    break;
                case ZYDIS_CONVERSION_MODE_FLOAT16:
                    operand->size = 256;
                    operand->element_type = ZYDIS_ELEMENT_TYPE_FLOAT16;
                    operand->element_size = 16;
                    break;
                case ZYDIS_CONVERSION_MODE_SINT16:
                    operand->size = 256;
                    operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
                    operand->element_size = 16;
                    break;
                case ZYDIS_CONVERSION_MODE_UINT16:
                    operand->size = 256;
                    operand->element_type = ZYDIS_ELEMENT_TYPE_UINT;
                    operand->element_size = 16;
                    break;
                case ZYDIS_CONVERSION_MODE_SINT8:
                    operand->size = 128;
                    operand->element_type = ZYDIS_ELEMENT_TYPE_INT;
                    operand->element_size = 8;
                    break;
                case ZYDIS_CONVERSION_MODE_UINT8:
                    operand->size = 128;
                    operand->element_type = ZYDIS_ELEMENT_TYPE_UINT;
                    operand->element_size = 8;
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }

                switch (instruction->avx.broadcast.mode)
                {
                case ZYDIS_BROADCAST_MODE_INVALID:
                    // Nothing to do here
                    break;
                case ZYDIS_BROADCAST_MODE_1_TO_8:
                case ZYDIS_BROADCAST_MODE_1_TO_16:
                    operand->size = operand->element_size;
                    break;
                case ZYDIS_BROADCAST_MODE_4_TO_8:
                case ZYDIS_BROADCAST_MODE_4_TO_16:
                    operand->size = operand->element_size * 4;
                    break;
                default:
                    ZYAN_UNREACHABLE;
                }
            }
#else
            ZYAN_UNREACHABLE;
#endif
            break;
        default:
            ZYAN_UNREACHABLE;
        }
        break;
    case ZYDIS_OPERAND_TYPE_POINTER:
        ZYAN_ASSERT((instruction->raw.imm[0].size == 16) ||
                    (instruction->raw.imm[0].size == 32));
        ZYAN_ASSERT( instruction->raw.imm[1].size == 16);
        operand->size = instruction->raw.imm[0].size + instruction->raw.imm[1].size;
        break;
    case ZYDIS_OPERAND_TYPE_IMMEDIATE:
        operand->size = definition->size[context->eosz_index] * 8;
        break;
    default:
        ZYAN_UNREACHABLE;
    }

    // Element-type and -size
    if (definition->element_type && (definition->element_type != ZYDIS_IELEMENT_TYPE_VARIABLE))
    {
        ZydisGetElementInfo(definition->element_type, &operand->element_type,
            &operand->element_size);
        if (!operand->element_size)
        {
            // The element size is the same as the operand size. This is used for single element
            // scaling operands
            operand->element_size = operand->size;
        }
    }

    // Element count
    if (operand->element_size && operand->size && (operand->element_type != ZYDIS_ELEMENT_TYPE_CC))
    {
        operand->element_count = operand->size / operand->element_size;
    } else
    {
        operand->element_count = 1;
    }
}